

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O0

int Map_LibraryGetMaxSuperPi_rec(Map_Super_t *pGate)

{
  int iVar1;
  int local_24;
  int VarMax;
  int VarCur;
  int i;
  Map_Super_t *pGate_local;
  
  local_24 = 0;
  if (pGate->pRoot == (Mio_Gate_t *)0x0) {
    pGate_local._4_4_ = pGate->Num;
  }
  else {
    for (VarMax = 0; VarMax < (int)(*(uint *)&pGate->field_0x4 >> 2 & 7); VarMax = VarMax + 1) {
      iVar1 = Map_LibraryGetMaxSuperPi_rec(pGate->pFanins[VarMax]);
      if (local_24 < iVar1) {
        local_24 = iVar1;
      }
    }
    pGate_local._4_4_ = local_24;
  }
  return pGate_local._4_4_;
}

Assistant:

int Map_LibraryGetMaxSuperPi_rec( Map_Super_t * pGate )
{
    int i, VarCur, VarMax = 0;
    if ( pGate->pRoot == NULL )
        return pGate->Num;
    for ( i = 0; i < (int)pGate->nFanins; i++ )
    {
        VarCur = Map_LibraryGetMaxSuperPi_rec( pGate->pFanins[i] );
        if ( VarMax < VarCur )
            VarMax = VarCur;
    }
    return VarMax;
}